

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::GenericSwap(Message *lhs,Message *rhs)

{
  Arena *pAVar1;
  MessageLite *this;
  Arena *pAVar2;
  undefined8 uVar3;
  Arena *pAVar4;
  undefined8 uVar5;
  MessageLite *other;
  Arena *arena;
  char *pcVar6;
  MessageLite *this_00;
  Metadata MVar7;
  LogMessageFatal aLStack_28 [16];
  
  pAVar1 = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  pAVar2 = pAVar1;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  arena = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  pAVar4 = arena;
  if (((ulong)arena & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (pAVar2 == pAVar4) {
    pcVar6 = "lhs->GetArena() != rhs->GetArena()";
    uVar3 = 0x22;
    uVar5 = 0x1a7;
LAB_002c1b1b:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/reflection_ops.cc"
               ,uVar5,uVar3,pcVar6);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
  }
  pAVar2 = pAVar1;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  if (pAVar2 == (Arena *)0x0) {
    pAVar2 = arena;
    if (((ulong)arena & 1) != 0) {
      pAVar2 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    if (pAVar2 == (Arena *)0x0) {
      pcVar6 = "lhs->GetArena() != nullptr || rhs->GetArena() != nullptr";
      uVar3 = 0x38;
      uVar5 = 0x1a8;
      goto LAB_002c1b1b;
    }
  }
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  other = &lhs->super_MessageLite;
  this_00 = &rhs->super_MessageLite;
  if ((arena == (Arena *)0x0) &&
     (other = &rhs->super_MessageLite, arena = pAVar1, this_00 = &lhs->super_MessageLite,
     ((ulong)pAVar1 & 1) != 0)) {
    arena = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  this = MessageLite::New(this_00,arena);
  MessageLite::CheckTypeAndMergeFrom(this,other);
  (*other->_vptr_MessageLite[2])(other);
  MessageLite::CheckTypeAndMergeFrom(other,this_00);
  MVar7 = Message::GetMetadata((Message *)this_00);
  Reflection::Swap(MVar7.reflection,(Message *)this,(Message *)this_00);
  return;
}

Assistant:

void GenericSwap(Message* lhs, Message* rhs) {
  if (!internal::DebugHardenForceCopyInSwap()) {
    ABSL_DCHECK(lhs->GetArena() != rhs->GetArena());
    ABSL_DCHECK(lhs->GetArena() != nullptr || rhs->GetArena() != nullptr);
  }
  // At least one of these must have an arena, so make `rhs` point to it.
  Arena* arena = rhs->GetArena();
  if (arena == nullptr) {
    std::swap(lhs, rhs);
    arena = rhs->GetArena();
  }

  // Improve efficiency by placing the temporary on an arena so that messages
  // are copied twice rather than three times.
  Message* tmp = rhs->New(arena);
  tmp->CheckTypeAndMergeFrom(*lhs);
  lhs->Clear();
  lhs->CheckTypeAndMergeFrom(*rhs);
  if (internal::DebugHardenForceCopyInSwap()) {
    rhs->Clear();
    rhs->CheckTypeAndMergeFrom(*tmp);
    if (arena == nullptr) delete tmp;
  } else {
    rhs->GetReflection()->Swap(tmp, rhs);
  }
}